

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whalesay.cpp
# Opt level: O0

Whale * __thiscall Whale::Say_abi_cxx11_(Whale *this,shared_ptr<IMessageHolder> *message)

{
  ulong uVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  __shared_ptr_access<IMessageHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  allocator local_229;
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [48];
  ulong local_1b0;
  size_t length;
  stringstream ss;
  ostream local_198 [384];
  shared_ptr<IMessageHolder> *message_local;
  Whale *this_local;
  
  message_local = message;
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&length);
  peVar3 = std::__shared_ptr_access<IMessageHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  iVar2 = (*peVar3->_vptr_IMessageHolder[1])();
  local_1b0 = CONCAT44(extraout_var,iVar2);
  poVar4 = std::operator<<(local_198," ");
  uVar1 = local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,uVar1,'_',&local_1e1);
  poVar4 = std::operator<<(poVar4,local_1e0);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  poVar4 = std::operator<<(local_198,"< ");
  peVar3 = std::__shared_ptr_access<IMessageHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  (**peVar3->_vptr_IMessageHolder)(local_208);
  poVar4 = std::operator<<(poVar4,local_208);
  poVar4 = std::operator<<(poVar4," >");
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_208);
  poVar4 = std::operator<<(local_198," ");
  uVar1 = local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,uVar1,'_',&local_229);
  poVar4 = std::operator<<(poVar4,local_228);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  poVar4 = std::operator<<(local_198,"    \\");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"     \\");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"      \\");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"       \\                     .");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"                             ==");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"                            ===");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"       \\______ o          __/");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"        \\    \\        __/");
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(local_198,"          \\____\\______/");
  std::operator<<(poVar4,'\n');
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&length);
  return this;
}

Assistant:

string Whale::Say(std::shared_ptr<IMessageHolder> message)
{
    std::stringstream ss;
    size_t length = message->GetLength();
	ss << " " << string(length,'_') << '\n';
	ss << "< " << message->GetMessage() << " >" << '\n';
	ss << " " << string(length,'_') << '\n';
	ss << "    \\" << '\n';
	ss << "     \\" << '\n';
	ss << "      \\" << '\n';
	ss << "       \\                     ." << '\n';
	ss << "                             ==" << '\n';
	ss << "                            ===" << '\n';
	ss << "       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===" << '\n';
	ss << "  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~" << '\n';
	ss << "       \\______ o          __/" << '\n';
	ss << "        \\    \\        __/" << '\n';
	ss << "          \\____\\______/" << '\n';

    return ss.str();
}